

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

void __thiscall sjtu::UserManager::logout(UserManager *this,int argc,string *argv)

{
  long lVar1;
  void *pvVar2;
  byte bVar3;
  long in_RDX;
  long in_RDI;
  pair<long,_bool> pVar4;
  userType *user;
  pair<long,_bool> tmp;
  string *in_stack_ffffffffffffff88;
  StringHasher *in_stack_ffffffffffffff90;
  string local_50 [32];
  hashType local_30;
  unsigned_long_long *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  
  std::__cxx11::string::string(local_50,(string *)(in_RDX + 0x20));
  local_30 = StringHasher::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pVar4 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                     CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  bVar3 = pVar4.second;
  std::__cxx11::string::~string(local_50);
  if ((bVar3 & 1) == 1) {
    lVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
                      (*(long **)(in_RDI + 0x10),&stack0xffffffffffffffd8);
    if (*(int *)(lVar1 + 0x6c) == *(int *)(in_RDI + 0x18)) {
      *(undefined4 *)(lVar1 + 0x6c) = 0;
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
      pvVar2 = (void *)std::ostream::operator<<(&std::cout,0);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar2 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void logout(int argc, std::string *argv) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(argv[1]));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (user->is_online == online_flag) {
                    user->is_online = 0;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;

        }